

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtp.c
# Opt level: O2

void rtp_rfc3119_pkt_init(rtp_pkt_t *pkt)

{
  rtp_pkt_init(pkt);
  *(byte *)&pkt->rfc3119_b = *(byte *)&pkt->rfc3119_b & 0xfc;
  pkt->b = (rtp_bits_t)((uint)pkt->b & 0xffff01ff | 0xc000);
  pkt->hlen = pkt->hlen + 1;
  pkt->pack = rtp_rfc3119_pkt_pack;
  pkt->unpack = rtp_rfc3119_pkt_unpack;
  return;
}

Assistant:

void rtp_rfc3119_pkt_init(rtp_pkt_t *pkt) {
  rtp_pkt_init(pkt);
  pkt->rfc3119_b.c = 0;
  pkt->rfc3119_b.t = 0;
  pkt->b.pt = RTP_DYN;
  pkt->hlen += 1; /* short rfc3119 header version */
  pkt->pack = rtp_rfc3119_pkt_pack;
  pkt->unpack = rtp_rfc3119_pkt_unpack;
}